

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

int CompareChunksProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                     Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  long lVar6;
  uint *data;
  uint *puVar7;
  uint *data_00;
  
  data = (uint *)chunks->data;
  data_00 = (uint *)chunks[1].data;
  if (data_00 == (uint *)0x0) {
    if (*clientData != (size_t *)0x0) {
      **clientData = index;
    }
    if (*(long *)((long)clientData + 8) != 0) {
      CVar1 = chunks->format;
      uVar2 = 0xffffffff;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          uVar2 = (uint)(byte)*data;
        }
        else if (CVar1 == COL_UCS2) {
          uVar2 = (uint)(ushort)*data;
        }
      }
      else if (CVar1 == COL_UCS4) {
        uVar2 = *data;
      }
      else if (CVar1 == COL_UTF8) {
        uVar2 = Col_Utf8Get((Col_Char1 *)data);
      }
      else if (CVar1 == COL_UTF16) {
        uVar2 = Col_Utf16Get((Col_Char2 *)data);
      }
      **(uint **)((long)clientData + 8) = uVar2;
    }
    iVar5 = 1;
    if (*(undefined4 **)((long)clientData + 0x10) != (undefined4 *)0x0) {
      **(undefined4 **)((long)clientData + 0x10) = 0xffffffff;
    }
  }
  else if (data == (uint *)0x0) {
    if (*clientData != (size_t *)0x0) {
      **clientData = index;
    }
    if (*(undefined4 **)((long)clientData + 8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)clientData + 8) = 0xffffffff;
    }
    if (*(long *)((long)clientData + 0x10) != 0) {
      CVar1 = chunks[1].format;
      uVar2 = 0xffffffff;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          uVar2 = (uint)(byte)*data_00;
        }
        else if (CVar1 == COL_UCS2) {
          uVar2 = (uint)(ushort)*data_00;
        }
      }
      else if (CVar1 == COL_UCS4) {
        uVar2 = *data_00;
      }
      else if (CVar1 == COL_UTF8) {
        uVar2 = Col_Utf8Get((Col_Char1 *)data_00);
      }
      else if (CVar1 == COL_UTF16) {
        uVar2 = Col_Utf16Get((Col_Char2 *)data_00);
      }
      **(uint **)((long)clientData + 0x10) = uVar2;
    }
    iVar5 = -1;
  }
  else {
    if (length != 0 && data != data_00) {
      lVar6 = 0;
      do {
        CVar1 = chunks->format;
        uVar2 = 0xffffffff;
        if ((int)CVar1 < 4) {
          if (CVar1 == COL_UCS1) {
            uVar2 = (uint)(byte)*data;
          }
          else if (CVar1 == COL_UCS2) {
            uVar2 = (uint)(ushort)*data;
          }
        }
        else if (CVar1 == COL_UCS4) {
          uVar2 = *data;
        }
        else if (CVar1 == COL_UTF8) {
          uVar2 = Col_Utf8Get((Col_Char1 *)data);
        }
        else if (CVar1 == COL_UTF16) {
          uVar2 = Col_Utf16Get((Col_Char2 *)data);
        }
        CVar1 = chunks[1].format;
        uVar3 = 0xffffffff;
        if ((int)CVar1 < 4) {
          if (CVar1 == COL_UCS1) {
            uVar3 = (uint)(byte)*data_00;
          }
          else if (CVar1 == COL_UCS2) {
            uVar3 = (uint)(ushort)*data_00;
          }
        }
        else if (CVar1 == COL_UCS4) {
          uVar3 = *data_00;
        }
        else if (CVar1 == COL_UTF8) {
          uVar3 = Col_Utf8Get((Col_Char1 *)data_00);
        }
        else if (CVar1 == COL_UTF16) {
          uVar3 = Col_Utf16Get((Col_Char2 *)data_00);
        }
        if (uVar2 != uVar3) {
          if (*clientData != (long *)0x0) {
            **clientData = index - lVar6;
          }
          if (*(uint **)((long)clientData + 8) != (uint *)0x0) {
            **(uint **)((long)clientData + 8) = uVar2;
          }
          if (*(uint **)((long)clientData + 0x10) != (uint *)0x0) {
            **(uint **)((long)clientData + 0x10) = uVar3;
          }
          return (uVar3 < uVar2) - 1 | 1;
        }
        CVar1 = chunks->format;
        if ((int)CVar1 < 4) {
          if (CVar1 == COL_UCS1) {
            puVar7 = (uint *)((long)data + 1);
          }
          else {
            puVar7 = (uint *)0x0;
            if (CVar1 == COL_UCS2) {
              puVar7 = (uint *)((long)data + 2);
            }
          }
        }
        else if (CVar1 == COL_UCS4) {
          puVar7 = data + 1;
        }
        else if (CVar1 == COL_UTF8) {
          puVar7 = (uint *)Col_Utf8Next((Col_Char1 *)data);
        }
        else {
          puVar7 = (uint *)0x0;
          if (CVar1 == COL_UTF16) {
            puVar7 = (uint *)Col_Utf16Next((Col_Char2 *)data);
          }
        }
        CVar1 = chunks[1].format;
        if ((int)CVar1 < 4) {
          if (CVar1 == COL_UCS1) {
            puVar4 = (uint *)((long)data_00 + 1);
          }
          else {
            puVar4 = (uint *)0x0;
            if (CVar1 == COL_UCS2) {
              puVar4 = (uint *)((long)data_00 + 2);
            }
          }
        }
        else if (CVar1 == COL_UCS4) {
          puVar4 = data_00 + 1;
        }
        else if (CVar1 == COL_UTF8) {
          puVar4 = (uint *)Col_Utf8Next((Col_Char1 *)data_00);
        }
        else {
          puVar4 = (uint *)0x0;
          if (CVar1 == COL_UTF16) {
            puVar4 = (uint *)Col_Utf16Next((Col_Char2 *)data_00);
          }
        }
        lVar6 = lVar6 + -1;
        data = puVar7;
        data_00 = puVar4;
      } while (-lVar6 != length);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
CompareChunksProc(
    size_t index,               /*!< Rope-relative index where chunks begin. */
    size_t length,              /*!< Length of chunks. */
    size_t number,              /*!< Number of chunks. Always 2. */
    const Col_RopeChunk *chunks,/*!< Array of chunks. When chunk is NULL, means
                                     the index is past the end of the traversed
                                     rope. */

    /*! [in,out] Points to #CompareChunksInfo. */
    Col_ClientData clientData)
{
    CompareChunksInfo *info = (CompareChunksInfo *) clientData;
    size_t i;
    const char *p1, *p2;
    Col_Char c1, c2;
    const char *data[2] = {(const char *) chunks[0].data,
            (const char *) chunks[1].data};

    ASSERT(number == 2);

    /*
     * Quick cases.
     */

    if (!data[1]) {
        /*
         * Chunk 1 is longer.
         */

        ASSERT(data[0]);
        if (info->posPtr) *info->posPtr = index;
        if (info->c1Ptr) *info->c1Ptr = COL_CHAR_GET(chunks[0].format, data[0]);
        if (info->c2Ptr) *info->c2Ptr = COL_CHAR_INVALID;
        return 1;
    } else if (!chunks[0].data) {
        /*
         * Chunk 2 is longer.
         */

        ASSERT(data[1]);
        if (info->posPtr) *info->posPtr = index;
        if (info->c1Ptr) *info->c1Ptr = COL_CHAR_INVALID;
        if (info->c2Ptr) *info->c2Ptr = COL_CHAR_GET(chunks[1].format, data[1]);
        return -1;
    } else if (data[0] == data[1]) {
        /*
         * Chunks are identical.
         */

        return 0;
    }

    /*
     * Compare char by char.
     */

    ASSERT(data[0]);
    ASSERT(data[1]);
    p1 = data[0];
    p2 = data[1];
    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks[0].format, p1),
            COL_CHAR_NEXT(chunks[1].format, p2)) {
        c1 = COL_CHAR_GET(chunks[0].format, p1);
        c2 = COL_CHAR_GET(chunks[1].format, p2);
        if (c1 != c2) {
            if (info->posPtr) *info->posPtr = index+i;
            if (info->c1Ptr) *info->c1Ptr = c1;
            if (info->c2Ptr) *info->c2Ptr = c2;
            return (c1 > c2 ? 1 : -1);
        }
    }

    /*
     * Chunks were equal.
     */

    return 0;
}